

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O0

void thread2(void)

{
  _Bool _Var1;
  char local_58 [8];
  char str [64];
  uint local_c;
  int tok;
  
  put_str("[Thread 2] started");
  local_c = 0;
  while (_Var1 = shutting_down(), ((_Var1 ^ 0xffU) & 1) != 0) {
    if (message != MsgNone) {
      if (message == MsgPing) {
        fprintf((FILE *)out,"[Thread 2] received ping: %d\n",(ulong)local_c);
        message = MsgNone;
      }
      else if (message == MsgFork) {
        fprintf((FILE *)out,"[Thread 2] forking worker: %d\n",(ulong)local_c);
        thread_start(the_thread->sched,worker);
        message = MsgNone;
      }
    }
    local_c = local_c + 1;
    snprintf(local_58,0x40,"[Thread 2] running: %d");
    put_str(local_58);
    yield();
  }
  put_str("[Thread 2] exiting");
  return;
}

Assistant:

static void
thread2(void)
{
    put_str("[Thread 2] started");
    int tok = 0;
    while (!shutting_down()) {
        switch (message) {
        case MsgNone:
            break;
        case MsgPing:
            fprintf(out, "[Thread 2] received ping: %d\n", tok);
            message = MsgNone;
            break;
        case MsgFork:
            fprintf(out, "[Thread 2] forking worker: %d\n", tok);
            thread_start(the_thread->sched, worker);
            message = MsgNone;
            break;
        }
        char str[64];
        snprintf(str, sizeof str, "[Thread 2] running: %d", tok++);
        put_str(str);
        yield();
    }
    put_str("[Thread 2] exiting");
}